

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapFieldBase::LookupMapValueNoSync
          (MapFieldBase *this,MapKey *map_key,MapValueConstRef *val)

{
  KeyMapBase<bool> *this_00;
  bool bVar1;
  CppType CVar2;
  uint32_t uVar3;
  NodeBase *pNVar4;
  string_view k;
  NodeAndBucket NVar5;
  MapValueConstRef **local_30;
  MapValueConstRef *val_local;
  uint64_t local_20;
  
  if ((int)this[1].super_MapFieldBaseForParse.payload_._M_i == 0) {
    return false;
  }
  local_30 = &val_local;
  val_local = val;
  CVar2 = MapKey::type(map_key);
  if (8 < CVar2 - CPPTYPE_INT32) {
switchD_00ca4895_caseD_5:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                ,0x46);
  }
  this_00 = (KeyMapBase<bool> *)(this + 1);
  switch(CVar2) {
  case CPPTYPE_INT32:
    uVar3 = MapKey::GetInt32Value(map_key);
    break;
  case CPPTYPE_INT64:
    local_20 = MapKey::GetInt64Value(map_key);
    goto LAB_00ca491e;
  case CPPTYPE_UINT32:
    uVar3 = MapKey::GetUInt32Value(map_key);
    break;
  case CPPTYPE_UINT64:
    local_20 = MapKey::GetUInt64Value(map_key);
LAB_00ca491e:
    bVar1 = const::$_0::operator()(&local_30,(KeyMapBase<unsigned_long> *)this_00,&local_20);
    return bVar1;
  default:
    goto switchD_00ca4895_caseD_5;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(map_key);
    NVar5 = KeyMapBase<bool>::FindHelper(this_00,bVar1);
    pNVar4 = NVar5.node;
    goto LAB_00ca48d3;
  case CPPTYPE_STRING:
    k = MapKey::GetStringValue(map_key);
    NVar5 = KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,k);
    pNVar4 = NVar5.node;
LAB_00ca48d3:
    if (pNVar4 == (NodeBase *)0x0) {
      return false;
    }
    if (val_local != (MapValueConstRef *)0x0) {
      val_local->data_ =
           (void *)((long)&pNVar4->next +
                   (ulong)*(byte *)((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ + 6
                                   ));
      return true;
    }
    return true;
  }
  local_20 = CONCAT44(local_20._4_4_,uVar3);
  bVar1 = const::$_0::operator()(&local_30,(KeyMapBase<unsigned_int> *)this_00,(uint *)&local_20);
  return bVar1;
}

Assistant:

bool MapFieldBase::LookupMapValueNoSync(const MapKey& map_key,
                                        MapValueConstRef* val) const {
  auto& map = GetMapRaw();
  if (map.empty()) return false;

  return VisitMapKey(map_key, map, [&](auto& map, const auto& key) {
    auto res = map.FindHelper(key);
    if (res.node == nullptr) {
      return false;
    }
    if (val != nullptr) {
      val->SetValue(map.GetVoidValue(res.node));
    }
    return true;
  });
}